

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O0

uc_err uc_query(uc_engine *uc,uc_query_type type,size_t *result)

{
  uc_err uVar1;
  int __init_ret;
  size_t *result_local;
  uc_query_type type_local;
  uc_engine *uc_local;
  
  if ((((uc->init_done ^ 0xffU) & 1) == 0) ||
     (uc_local._4_4_ = uc_init_engine(uc), uc_local._4_4_ == UC_ERR_OK)) {
    switch(type) {
    case UC_QUERY_MODE:
      if (uc->arch == UC_ARCH_ARM) {
        uVar1 = (*uc->query)(uc,type,result);
        return uVar1;
      }
      *result = (ulong)uc->mode;
      break;
    case UC_QUERY_PAGE_SIZE:
      *result = (ulong)uc->target_page_size;
      break;
    case UC_QUERY_ARCH:
      *result = (ulong)uc->arch;
      break;
    case UC_QUERY_TIMEOUT:
      *result = (ulong)(uc->timed_out & 1);
      break;
    default:
      return UC_ERR_ARG;
    }
    uc_local._4_4_ = UC_ERR_OK;
  }
  return uc_local._4_4_;
}

Assistant:

UNICORN_EXPORT
uc_err uc_query(uc_engine *uc, uc_query_type type, size_t *result)
{
    UC_INIT(uc);

    switch (type) {
    default:
        return UC_ERR_ARG;

    case UC_QUERY_PAGE_SIZE:
        *result = uc->target_page_size;
        break;

    case UC_QUERY_ARCH:
        *result = uc->arch;
        break;

    case UC_QUERY_MODE:
#ifdef UNICORN_HAS_ARM
        if (uc->arch == UC_ARCH_ARM) {
            return uc->query(uc, type, result);
        }
#endif
        *result = uc->mode;
        break;

    case UC_QUERY_TIMEOUT:
        *result = uc->timed_out;
        break;
    }

    return UC_ERR_OK;
}